

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove_temp_var.hpp
# Opt level: O0

void __thiscall
optimization::remove_temp_var::Remove_Temp_Var::optimize_func
          (Remove_Temp_Var *this,MirFunction *func)

{
  bool bVar1;
  MirFunction *__args;
  long in_RSI;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *in_RDI;
  pair<const_int,_mir::inst::BasicBlk> *blkpair;
  iterator __end2;
  iterator __begin2;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *__range2;
  BasicBlk *in_stack_00000068;
  Remove_Temp_Var *in_stack_00000070;
  shared_ptr<optimization::remove_temp_var::Env> *in_stack_ffffffffffffffc0;
  _Self local_28;
  _Self local_20;
  
  __args = (MirFunction *)(in_RSI + 0x68);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
       ::begin(in_RDI);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
       ::end(in_RDI);
  while( true ) {
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator*
              ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x13bd92);
    std::make_shared<optimization::remove_temp_var::Env,mir::inst::MirFunction&>(__args);
    std::shared_ptr<optimization::remove_temp_var::Env>::operator=
              (in_stack_ffffffffffffffc0,(shared_ptr<optimization::remove_temp_var::Env> *)in_RDI);
    std::shared_ptr<optimization::remove_temp_var::Env>::~shared_ptr
              ((shared_ptr<optimization::remove_temp_var::Env> *)0x13bdc1);
    optimize_blk(in_stack_00000070,in_stack_00000068);
    std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
               in_stack_ffffffffffffffc0);
  }
  return;
}

Assistant:

void optimize_func(mir::inst::MirFunction& func) {
    for (auto& blkpair : func.basic_blks) {
      env = std::make_shared<Env>(func);
      optimize_blk(blkpair.second);
    }
  }